

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O2

int SMPI_Bcast(void *buffer,int count,SMPI_Datatype datatype,int root,SMPI_Comm comm)

{
  string local_28;
  
  switch(datatype) {
  case SMPI_INT:
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    local_28._M_string_length = 0;
    local_28.field_2._M_local_buf[0] = '\0';
    adios2::helper::Comm::Bcast<int>((Comm *)comm,(int *)buffer,(long)count,root,&local_28);
    break;
  case SMPI_LONG:
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    local_28._M_string_length = 0;
    local_28.field_2._M_local_buf[0] = '\0';
    adios2::helper::Comm::Bcast<long>((Comm *)comm,(long *)buffer,(long)count,root,&local_28);
    break;
  case SMPI_SIZE_T:
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    local_28._M_string_length = 0;
    local_28.field_2._M_local_buf[0] = '\0';
    adios2::helper::Comm::Bcast<unsigned_long>
              ((Comm *)comm,(unsigned_long *)buffer,(long)count,root,&local_28);
    break;
  case SMPI_CHAR:
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    local_28._M_string_length = 0;
    local_28.field_2._M_local_buf[0] = '\0';
    adios2::helper::Comm::Bcast<char>((Comm *)comm,(char *)buffer,(long)count,root,&local_28);
    break;
  case SMPI_BYTE:
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    local_28._M_string_length = 0;
    local_28.field_2._M_local_buf[0] = '\0';
    adios2::helper::Comm::Bcast<unsigned_char>
              ((Comm *)comm,(uchar *)buffer,(long)count,root,&local_28);
    break;
  default:
    goto switchD_0011bf30_default;
  }
  std::__cxx11::string::~string((string *)&local_28);
switchD_0011bf30_default:
  return 0;
}

Assistant:

int SMPI_Bcast(void *buffer, int count, SMPI_Datatype datatype, int root, SMPI_Comm comm)
{
    switch (datatype)
    {
#define F(type) comm->Bcast(static_cast<type *>(buffer), count, root)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return 0;
}